

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

void png_set_tIME(png_const_structrp png_ptr,png_inforp info_ptr,png_const_timep mod_time)

{
  byte *pbVar1;
  
  if ((mod_time != (png_const_timep)0x0 &&
       (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0)) &&
     ((png_ptr->mode & 0x200) == 0)) {
    if ((((byte)(mod_time->month - 0xd) < 0xf4) ||
        ((((byte)(mod_time->day - 0x20) < 0xe1 || (0x17 < mod_time->hour)) ||
         (0x3b < mod_time->minute)))) || (0x3c < mod_time->second)) {
      png_warning(png_ptr,"Ignoring invalid time value");
      return;
    }
    info_ptr->mod_time = *mod_time;
    pbVar1 = (byte *)((long)&info_ptr->valid + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return;
}

Assistant:

void PNGAPI
png_set_tIME(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_timep mod_time)
{
   png_debug1(1, "in %s storage function", "tIME");

   if (png_ptr == NULL || info_ptr == NULL || mod_time == NULL ||
       (png_ptr->mode & PNG_WROTE_tIME) != 0)
      return;

   if (mod_time->month == 0   || mod_time->month > 12  ||
       mod_time->day   == 0   || mod_time->day   > 31  ||
       mod_time->hour  > 23   || mod_time->minute > 59 ||
       mod_time->second > 60)
   {
      png_warning(png_ptr, "Ignoring invalid time value");

      return;
   }

   info_ptr->mod_time = *mod_time;
   info_ptr->valid |= PNG_INFO_tIME;
}